

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O2

void __thiscall
solitaire::graphics::
SDLGraphicsSystemAfterWindowCreationFailedTests_throwOnLoadTextureIfWindowNotCreated_Test::TestBody
          (SDLGraphicsSystemAfterWindowCreationFailedTests_throwOnLoadTextureIfWindowNotCreated_Test
           *this)

{
  bool bVar1;
  AssertHelper AStack_58;
  char *local_50;
  undefined8 local_48;
  char local_40 [16];
  GraphicsSystem local_30;
  
  local_50 = local_40;
  local_40[0] = '\0';
  local_40[1] = '\0';
  local_40[2] = '\0';
  local_40[3] = '\0';
  local_40[4] = '\0';
  local_40[5] = '\0';
  local_40[6] = '\0';
  local_40[7] = '\0';
  local_40[8] = '\0';
  local_40[9] = '\0';
  local_40[10] = '\0';
  local_40[0xb] = '\0';
  local_40[0xc] = '\0';
  local_40[0xd] = '\0';
  local_40[0xe] = '\0';
  local_40[0xf] = '\0';
  local_48 = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    SDLGraphicsSystem::loadTexture
              ((SDLGraphicsSystem *)&stack0xffffffffffffffd0,
               (string *)
               &(this->super_SDLGraphicsSystemAfterWindowCreationFailedTests).
                super_SDLGraphicsSystemTests.system);
  }
  std::__cxx11::string::assign((char *)&local_50);
  testing::Message::Message((Message *)&stack0xffffffffffffffd0);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_58,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
             ,0xb8,local_50);
  testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&stack0xffffffffffffffd0);
  testing::internal::AssertHelper::~AssertHelper(&AStack_58);
  if (local_30._vptr_GraphicsSystem != (_func_int **)0x0) {
    (**(code **)(*local_30._vptr_GraphicsSystem + 8))();
  }
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

TEST_F(SDLGraphicsSystemAfterWindowCreationFailedTests,
       throwOnLoadTextureIfWindowNotCreated)
{
    EXPECT_THROW(system.loadTexture(texturePath), std::runtime_error);
}